

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__7,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  EnumDescriptor *pEVar1;
  undefined8 *puVar2;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  local_58.piece_ = NullSafeStringView("Enum type \"");
  pEVar1 = google::protobuf::FieldDescriptor::enum_type((FieldDescriptor *)**(undefined8 **)this);
  local_88.piece_._M_str = (pEVar1->all_names_).payload_;
  local_88.piece_._M_len = (size_t)*(ushort *)(local_88.piece_._M_str + 2);
  local_88.piece_._M_str = local_88.piece_._M_str + ~local_88.piece_._M_len;
  local_b8.piece_ = NullSafeStringView("\" has no value named \"");
  puVar2 = (undefined8 *)(*(ulong *)(*(long *)(this + 8) + 0x30) & 0xfffffffffffffffc);
  local_e8.piece_._M_str = (char *)*puVar2;
  local_e8.piece_._M_len = puVar2[1];
  local_118.piece_ = NullSafeStringView("\".");
  StrCat<>(__return_storage_ptr__,&local_58,&local_88,&local_b8,&local_e8,&local_118);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}